

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmAddCustomTargetCommand.cxx
# Opt level: O1

bool __thiscall
cmAddCustomTargetCommand::InitialPass
          (cmAddCustomTargetCommand *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *args,cmExecutionStatus *param_2)

{
  string *input;
  pointer pcVar1;
  cmMakefile *pcVar2;
  bool command_expand_lists;
  byte bVar3;
  bool uses_terminal;
  bool bVar4;
  bool bVar5;
  int iVar6;
  uint uVar7;
  PolicyStatus PVar8;
  long lVar9;
  ostream *poVar10;
  pointer pbVar11;
  char *pcVar12;
  cmTarget *this_00;
  ulong uVar13;
  ulong uVar14;
  PolicyID id;
  MessageType t;
  ulong uVar15;
  value_type *__x;
  undefined4 uVar16;
  bool bVar17;
  bool local_2c8;
  string local_2a8;
  cmCustomCommandLine currentLine;
  string working_directory;
  char *local_248;
  cmCustomCommandLines commandLines;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  byproducts;
  string comment_buffer;
  ostringstream e;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1d0 [6];
  ios_base local_170 [264];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  sources;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  depends;
  
  input = (args->
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )._M_impl.super__Vector_impl_data._M_start;
  if (input == (args->
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )._M_impl.super__Vector_impl_data._M_finish) {
    _e = (pointer)local_1d0;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&e,"called with incorrect number of arguments","");
    cmCommand::SetError(&this->super_cmCommand,(string *)&e);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)_e != local_1d0) {
      operator_delete(_e,CONCAT71(local_1d0[0]._M_allocated_capacity._1_7_,
                                  local_1d0[0]._M_local_buf[0]) + 1);
    }
    return false;
  }
  lVar9 = std::__cxx11::string::find_first_of((char *)input,0x55fe3e,0);
  if (lVar9 != -1) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&e);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&e,"called with invalid target name \"",0x21);
    poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&e,(input->_M_dataplus)._M_p,input->_M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar10,"\".  Target names may not contain a slash.  ",0x2b);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar10,"Use ADD_CUSTOM_COMMAND to generate files.",0x29);
    std::__cxx11::stringbuf::str();
    cmCommand::SetError(&this->super_cmCommand,&working_directory);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)working_directory._M_dataplus._M_p != &working_directory.field_2) {
      operator_delete(working_directory._M_dataplus._M_p,
                      CONCAT71(working_directory.field_2._M_allocated_capacity._1_7_,
                               working_directory.field_2._M_local_buf[0]) + 1);
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&e);
    std::ios_base::~ios_base(local_170);
    return false;
  }
  currentLine.
  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  currentLine.
  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  currentLine.
  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  commandLines.super_vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>.
  super__Vector_base<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  commandLines.super_vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>.
  super__Vector_base<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  commandLines.super_vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>.
  super__Vector_base<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  depends.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  depends.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  depends.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  byproducts.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  byproducts.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  byproducts.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  working_directory._M_dataplus._M_p = (pointer)&working_directory.field_2;
  working_directory._M_string_length = 0;
  working_directory.field_2._M_local_buf[0] = '\0';
  comment_buffer._M_dataplus._M_p = (pointer)&comment_buffer.field_2;
  comment_buffer._M_string_length = 0;
  comment_buffer.field_2._M_local_buf[0] = '\0';
  sources.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  sources.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  sources.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  pbVar11 = (args->
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )._M_impl.super__Vector_impl_data._M_start;
  uVar7 = 1;
  local_2c8 = true;
  bVar17 = true;
  if (0x20 < (ulong)((long)(args->
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar11)) {
    iVar6 = std::__cxx11::string::compare((char *)(pbVar11 + 1));
    bVar17 = iVar6 != 0;
    uVar7 = 2 - bVar17;
  }
  uVar15 = (ulong)uVar7;
  pbVar11 = (args->
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )._M_impl.super__Vector_impl_data._M_start;
  uVar13 = (long)(args->
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar11 >> 5;
  uVar16 = 0;
  bVar5 = uVar15 < uVar13;
  if (uVar15 < uVar13) {
    bVar3 = 0;
    local_248 = (char *)0x0;
    command_expand_lists = false;
    uses_terminal = false;
    do {
      uVar7 = uVar7 + 1;
      uVar13 = (ulong)uVar7;
      __x = pbVar11 + uVar15;
      iVar6 = std::__cxx11::string::compare((char *)__x);
      bVar4 = true;
      if (iVar6 == 0) {
LAB_0028b426:
        bVar4 = true;
        uVar16 = 1;
      }
      else {
        iVar6 = std::__cxx11::string::compare((char *)__x);
        if (iVar6 == 0) {
LAB_0028b39e:
          bVar4 = true;
          uVar16 = 2;
        }
        else {
          iVar6 = std::__cxx11::string::compare((char *)__x);
          if (iVar6 == 0) {
            uVar16 = 3;
          }
          else {
            iVar6 = std::__cxx11::string::compare((char *)__x);
            if (iVar6 == 0) {
              bVar3 = 1;
            }
            else {
              iVar6 = std::__cxx11::string::compare((char *)__x);
              if (iVar6 != 0) {
                iVar6 = std::__cxx11::string::compare((char *)__x);
                bVar4 = true;
                if (iVar6 == 0) {
                  command_expand_lists = true;
                  uVar16 = 6;
                }
                else {
                  iVar6 = std::__cxx11::string::compare((char *)__x);
                  if (iVar6 == 0) {
LAB_0028b2d4:
                    uVar16 = 4;
                  }
                  else {
                    iVar6 = std::__cxx11::string::compare((char *)__x);
                    if (iVar6 == 0) {
                      uVar16 = 0;
                      if (currentLine.
                          super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          .
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start !=
                          currentLine.
                          super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          .
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish) {
                        std::vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>::
                        push_back(&commandLines.
                                   super_vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>
                                  ,&currentLine);
                        std::
                        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ::_M_erase_at_end(&currentLine.
                                           super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                          ,currentLine.
                                           super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                           .
                                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                           ._M_impl.super__Vector_impl_data._M_start);
                      }
                    }
                    else {
                      iVar6 = std::__cxx11::string::compare((char *)__x);
                      if (iVar6 == 0) {
                        uVar16 = 5;
                      }
                      else {
                        switch(uVar16) {
                        case 0:
                          uVar16 = 0;
                          std::
                          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ::push_back(&currentLine.
                                       super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      ,__x);
                          break;
                        case 1:
                          _e = (pointer)local_1d0;
                          pcVar1 = (__x->_M_dataplus)._M_p;
                          std::__cxx11::string::_M_construct<char*>
                                    ((string *)&e,pcVar1,pcVar1 + __x->_M_string_length);
                          cmsys::SystemTools::ConvertToUnixSlashes((string *)&e);
                          std::
                          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ::push_back(&depends,(string *)&e);
                          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                               *)_e != local_1d0) {
                            operator_delete(_e,CONCAT71(local_1d0[0]._M_allocated_capacity._1_7_,
                                                        local_1d0[0]._M_local_buf[0]) + 1);
                          }
                          goto LAB_0028b426;
                        case 2:
                          _e = (pointer)local_1d0;
                          local_1d0[0]._M_local_buf[0] = '\0';
                          bVar4 = cmsys::SystemTools::FileIsFullPath((__x->_M_dataplus)._M_p);
                          if (!bVar4) {
                            pcVar12 = cmMakefile::GetCurrentBinaryDirectory
                                                ((this->super_cmCommand).Makefile);
                            std::__cxx11::string::operator=((string *)&e,pcVar12);
                            std::__cxx11::string::append((char *)&e);
                          }
                          std::__cxx11::string::_M_append((char *)&e,(ulong)(__x->_M_dataplus)._M_p)
                          ;
                          cmsys::SystemTools::ConvertToUnixSlashes((string *)&e);
                          std::
                          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ::push_back(&byproducts,(value_type *)&e);
                          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                               *)_e != local_1d0) {
                            operator_delete(_e,CONCAT71(local_1d0[0]._M_allocated_capacity._1_7_,
                                                        local_1d0[0]._M_local_buf[0]) + 1);
                          }
                          goto LAB_0028b39e;
                        case 3:
                          std::__cxx11::string::_M_assign((string *)&working_directory);
                          uVar16 = 3;
                          break;
                        case 4:
                          std::__cxx11::string::_M_assign((string *)&comment_buffer);
                          local_248 = comment_buffer._M_dataplus._M_p;
                          goto LAB_0028b2d4;
                        case 5:
                          std::
                          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ::push_back(&sources,__x);
                          uVar16 = 5;
                          break;
                        default:
                          _e = (pointer)local_1d0;
                          std::__cxx11::string::_M_construct<char_const*>
                                    ((string *)&e,"Wrong syntax. Unknown type of argument.","");
                          cmCommand::SetError(&this->super_cmCommand,(string *)&e);
                          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                               *)_e != local_1d0) {
                            operator_delete(_e,CONCAT71(local_1d0[0]._M_allocated_capacity._1_7_,
                                                        local_1d0[0]._M_local_buf[0]) + 1);
                          }
                          bVar4 = false;
                        }
                      }
                    }
                  }
                }
                goto LAB_0028b42c;
              }
              uses_terminal = true;
            }
            uVar16 = 6;
            bVar4 = true;
          }
        }
      }
LAB_0028b42c:
      if (!bVar4) break;
      pbVar11 = (args->
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                )._M_impl.super__Vector_impl_data._M_start;
      uVar14 = (long)(args->
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar11 >> 5;
      bVar5 = uVar13 < uVar14;
      uVar15 = uVar13;
    } while (uVar13 < uVar14);
    local_2c8 = (bool)(bVar3 ^ 1);
  }
  else {
    uses_terminal = false;
    command_expand_lists = false;
    local_248 = (char *)0x0;
  }
  if (!bVar5) {
    lVar9 = std::__cxx11::string::find_first_of((char *)input,0x55b631,0);
    if (lVar9 == -1) {
      bVar5 = cmGeneratorExpression::IsValidTargetName(input);
      if (bVar5) {
        bVar5 = cmGlobalGenerator::IsReservedTarget(input);
        bVar5 = !bVar5;
      }
      else {
        bVar5 = false;
      }
      if (bVar5) {
        lVar9 = std::__cxx11::string::find((char)input,0x3a);
        bVar5 = lVar9 == -1;
      }
      if (!bVar5) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&e);
        PVar8 = cmMakefile::GetPolicyStatus((this->super_cmCommand).Makefile,CMP0037);
        if (PVar8 - NEW < 3) {
          t = FATAL_ERROR;
          bVar4 = true;
          bVar5 = true;
        }
        else {
          bVar4 = false;
          t = AUTHOR_WARNING;
          bVar5 = false;
          if (PVar8 == WARN) {
            cmPolicies::GetPolicyWarning_abi_cxx11_(&local_2a8,(cmPolicies *)0x25,id);
            poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)&e,
                                 (char *)CONCAT71(local_2a8._M_dataplus._M_p._1_7_,
                                                  (char)local_2a8._M_dataplus._M_p),
                                 local_2a8._M_string_length);
            std::__ostream_insert<char,std::char_traits<char>>(poVar10,"\n",1);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)CONCAT71(local_2a8._M_dataplus._M_p._1_7_,(char)local_2a8._M_dataplus._M_p) !=
                &local_2a8.field_2) {
              operator_delete((undefined1 *)
                              CONCAT71(local_2a8._M_dataplus._M_p._1_7_,
                                       (char)local_2a8._M_dataplus._M_p),
                              local_2a8.field_2._M_allocated_capacity + 1);
            }
            bVar5 = true;
            bVar4 = false;
            t = AUTHOR_WARNING;
          }
        }
        if (bVar5) {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&e,"The target name \"",0x11);
          poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)&e,(input->_M_dataplus)._M_p,input->_M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar10,
                     "\" is reserved or not valid for certain CMake features, such as generator expressions, and may result in undefined behavior."
                     ,0x7b);
          pcVar2 = (this->super_cmCommand).Makefile;
          std::__cxx11::stringbuf::str();
          cmMakefile::IssueMessage(pcVar2,t,&local_2a8);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)CONCAT71(local_2a8._M_dataplus._M_p._1_7_,(char)local_2a8._M_dataplus._M_p) !=
              &local_2a8.field_2) {
            operator_delete((undefined1 *)
                            CONCAT71(local_2a8._M_dataplus._M_p._1_7_,
                                     (char)local_2a8._M_dataplus._M_p),
                            local_2a8.field_2._M_allocated_capacity + 1);
          }
          if (bVar4) goto LAB_0028b5d8;
        }
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)&e);
        std::ios_base::~ios_base(local_170);
      }
      if (currentLine.
          super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start !=
          currentLine.
          super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish) {
        std::vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>::push_back
                  (&commandLines.
                    super_vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>,
                   &currentLine);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::_M_erase_at_end(&currentLine.
                           super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ,currentLine.
                           super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           .
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start);
      }
      local_1d0[0]._M_local_buf[0] = '\0';
      _e = (pointer)local_1d0;
      bVar5 = cmMakefile::EnforceUniqueName
                        ((this->super_cmCommand).Makefile,input,(string *)&e,true);
      if (bVar5) {
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)_e != local_1d0) {
          operator_delete(_e,CONCAT71(local_1d0[0]._M_allocated_capacity._1_7_,
                                      local_1d0[0]._M_local_buf[0]) + 1);
        }
      }
      else {
        cmCommand::SetError(&this->super_cmCommand,(string *)&e);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)_e != local_1d0) {
          operator_delete(_e,CONCAT71(local_1d0[0]._M_allocated_capacity._1_7_,
                                      local_1d0[0]._M_local_buf[0]) + 1);
        }
        if (!bVar5) goto LAB_0028b5f9;
      }
      if (working_directory._M_string_length != 0) {
        pcVar12 = cmMakefile::GetCurrentBinaryDirectory((this->super_cmCommand).Makefile);
        cmsys::SystemTools::CollapseFullPath((string *)&e,&working_directory,pcVar12);
        std::__cxx11::string::operator=((string *)&working_directory,(string *)&e);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)_e != local_1d0) {
          operator_delete(_e,CONCAT71(local_1d0[0]._M_allocated_capacity._1_7_,
                                      local_1d0[0]._M_local_buf[0]) + 1);
        }
      }
      if (commandLines.super_vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>.
          super__Vector_base<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>._M_impl.
          super__Vector_impl_data._M_start ==
          commandLines.super_vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>.
          super__Vector_base<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>._M_impl.
          super__Vector_impl_data._M_finish) {
        if (byproducts.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start ==
            byproducts.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish) {
          if (commandLines.super_vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>.
              super__Vector_base<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>._M_impl.
              super__Vector_impl_data._M_start !=
              commandLines.super_vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>.
              super__Vector_base<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>._M_impl.
              super__Vector_impl_data._M_finish) goto LAB_0028b944;
          if (uses_terminal) {
            pcVar2 = (this->super_cmCommand).Makefile;
            _e = (pointer)local_1d0;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&e,"USES_TERMINAL may not be specified without any COMMAND","");
            cmMakefile::IssueMessage(pcVar2,FATAL_ERROR,(string *)&e);
          }
          else {
            if (!(bool)(commandLines.
                        super_vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>.
                        super__Vector_base<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>
                        ._M_impl.super__Vector_impl_data._M_start ==
                        commandLines.
                        super_vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>.
                        super__Vector_base<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>
                        ._M_impl.super__Vector_impl_data._M_finish & command_expand_lists))
            goto LAB_0028b944;
            pcVar2 = (this->super_cmCommand).Makefile;
            _e = (pointer)local_1d0;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&e,"COMMAND_EXPAND_LISTS may not be specified without any COMMAND",
                       "");
            cmMakefile::IssueMessage(pcVar2,FATAL_ERROR,(string *)&e);
          }
        }
        else {
          pcVar2 = (this->super_cmCommand).Makefile;
          _e = (pointer)local_1d0;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&e,"BYPRODUCTS may not be specified without any COMMAND","");
          cmMakefile::IssueMessage(pcVar2,FATAL_ERROR,(string *)&e);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)_e != local_1d0) {
          operator_delete(_e,CONCAT71(local_1d0[0]._M_allocated_capacity._1_7_,
                                      local_1d0[0]._M_local_buf[0]) + 1);
        }
        bVar17 = true;
      }
      else {
LAB_0028b944:
        this_00 = cmMakefile::AddUtilityCommand
                            ((this->super_cmCommand).Makefile,input,bVar17,
                             working_directory._M_dataplus._M_p,&byproducts,&depends,&commandLines,
                             local_2c8,local_248,uses_terminal,command_expand_lists);
        bVar17 = true;
        cmTarget::AddSources(this_00,&sources);
      }
      goto LAB_0028b5fb;
    }
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&e);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&e,"called with target name containing a \"",0x26);
    local_2a8._M_dataplus._M_p._0_1_ = (input->_M_dataplus)._M_p[lVar9];
    poVar10 = std::__ostream_insert<char,std::char_traits<char>>((ostream *)&e,(char *)&local_2a8,1)
    ;
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar10,"\".  This character is not allowed.",0x22);
    std::__cxx11::stringbuf::str();
    cmCommand::SetError(&this->super_cmCommand,&local_2a8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT71(local_2a8._M_dataplus._M_p._1_7_,(char)local_2a8._M_dataplus._M_p) !=
        &local_2a8.field_2) {
      operator_delete((undefined1 *)
                      CONCAT71(local_2a8._M_dataplus._M_p._1_7_,(char)local_2a8._M_dataplus._M_p),
                      local_2a8.field_2._M_allocated_capacity + 1);
    }
LAB_0028b5d8:
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&e);
    std::ios_base::~ios_base(local_170);
  }
LAB_0028b5f9:
  bVar17 = false;
LAB_0028b5fb:
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&sources);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)comment_buffer._M_dataplus._M_p != &comment_buffer.field_2) {
    operator_delete(comment_buffer._M_dataplus._M_p,
                    CONCAT71(comment_buffer.field_2._M_allocated_capacity._1_7_,
                             comment_buffer.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)working_directory._M_dataplus._M_p != &working_directory.field_2) {
    operator_delete(working_directory._M_dataplus._M_p,
                    CONCAT71(working_directory.field_2._M_allocated_capacity._1_7_,
                             working_directory.field_2._M_local_buf[0]) + 1);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&byproducts);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&depends);
  std::vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>::~vector
            (&commandLines.super_vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&currentLine.
             super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           );
  return bVar17;
}

Assistant:

bool cmAddCustomTargetCommand::InitialPass(
  std::vector<std::string> const& args, cmExecutionStatus&)
{
  if (args.empty()) {
    this->SetError("called with incorrect number of arguments");
    return false;
  }

  std::string const& targetName = args[0];

  // Check the target name.
  if (targetName.find_first_of("/\\") != std::string::npos) {
    std::ostringstream e;
    e << "called with invalid target name \"" << targetName
      << "\".  Target names may not contain a slash.  "
      << "Use ADD_CUSTOM_COMMAND to generate files.";
    this->SetError(e.str());
    return false;
  }

  // Accumulate one command line at a time.
  cmCustomCommandLine currentLine;

  // Save all command lines.
  cmCustomCommandLines commandLines;

  // Accumulate dependencies.
  std::vector<std::string> depends, byproducts;
  std::string working_directory;
  bool verbatim = false;
  bool uses_terminal = false;
  bool command_expand_lists = false;
  std::string comment_buffer;
  const char* comment = CM_NULLPTR;
  std::vector<std::string> sources;

  // Keep track of parser state.
  enum tdoing
  {
    doing_command,
    doing_depends,
    doing_byproducts,
    doing_working_directory,
    doing_comment,
    doing_source,
    doing_nothing
  };
  tdoing doing = doing_command;

  // Look for the ALL option.
  bool excludeFromAll = true;
  unsigned int start = 1;
  if (args.size() > 1) {
    if (args[1] == "ALL") {
      excludeFromAll = false;
      start = 2;
    }
  }

  // Parse the rest of the arguments.
  for (unsigned int j = start; j < args.size(); ++j) {
    std::string const& copy = args[j];

    if (copy == "DEPENDS") {
      doing = doing_depends;
    } else if (copy == "BYPRODUCTS") {
      doing = doing_byproducts;
    } else if (copy == "WORKING_DIRECTORY") {
      doing = doing_working_directory;
    } else if (copy == "VERBATIM") {
      doing = doing_nothing;
      verbatim = true;
    } else if (copy == "USES_TERMINAL") {
      doing = doing_nothing;
      uses_terminal = true;
    } else if (copy == "COMMAND_EXPAND_LISTS") {
      doing = doing_nothing;
      command_expand_lists = true;
    } else if (copy == "COMMENT") {
      doing = doing_comment;
    } else if (copy == "COMMAND") {
      doing = doing_command;

      // Save the current command before starting the next command.
      if (!currentLine.empty()) {
        commandLines.push_back(currentLine);
        currentLine.clear();
      }
    } else if (copy == "SOURCES") {
      doing = doing_source;
    } else {
      switch (doing) {
        case doing_working_directory:
          working_directory = copy;
          break;
        case doing_command:
          currentLine.push_back(copy);
          break;
        case doing_byproducts: {
          std::string filename;
          if (!cmSystemTools::FileIsFullPath(copy.c_str())) {
            filename = this->Makefile->GetCurrentBinaryDirectory();
            filename += "/";
          }
          filename += copy;
          cmSystemTools::ConvertToUnixSlashes(filename);
          byproducts.push_back(filename);
        } break;
        case doing_depends: {
          std::string dep = copy;
          cmSystemTools::ConvertToUnixSlashes(dep);
          depends.push_back(dep);
        } break;
        case doing_comment:
          comment_buffer = copy;
          comment = comment_buffer.c_str();
          break;
        case doing_source:
          sources.push_back(copy);
          break;
        default:
          this->SetError("Wrong syntax. Unknown type of argument.");
          return false;
      }
    }
  }

  std::string::size_type pos = targetName.find_first_of("#<>");
  if (pos != std::string::npos) {
    std::ostringstream msg;
    msg << "called with target name containing a \"" << targetName[pos]
        << "\".  This character is not allowed.";
    this->SetError(msg.str());
    return false;
  }

  // Some requirements on custom target names already exist
  // and have been checked at this point.
  // The following restrictions overlap but depend on policy CMP0037.
  bool nameOk = cmGeneratorExpression::IsValidTargetName(targetName) &&
    !cmGlobalGenerator::IsReservedTarget(targetName);
  if (nameOk) {
    nameOk = targetName.find(':') == std::string::npos;
  }
  if (!nameOk) {
    cmake::MessageType messageType = cmake::AUTHOR_WARNING;
    std::ostringstream e;
    bool issueMessage = false;
    switch (this->Makefile->GetPolicyStatus(cmPolicies::CMP0037)) {
      case cmPolicies::WARN:
        e << cmPolicies::GetPolicyWarning(cmPolicies::CMP0037) << "\n";
        issueMessage = true;
      case cmPolicies::OLD:
        break;
      case cmPolicies::NEW:
      case cmPolicies::REQUIRED_IF_USED:
      case cmPolicies::REQUIRED_ALWAYS:
        issueMessage = true;
        messageType = cmake::FATAL_ERROR;
    }
    if (issueMessage) {
      /* clang-format off */
      e << "The target name \"" << targetName <<
          "\" is reserved or not valid for certain "
          "CMake features, such as generator expressions, and may result "
          "in undefined behavior.";
      /* clang-format on */
      this->Makefile->IssueMessage(messageType, e.str());

      if (messageType == cmake::FATAL_ERROR) {
        return false;
      }
    }
  }

  // Store the last command line finished.
  if (!currentLine.empty()) {
    commandLines.push_back(currentLine);
    currentLine.clear();
  }

  // Enforce name uniqueness.
  {
    std::string msg;
    if (!this->Makefile->EnforceUniqueName(targetName, msg, true)) {
      this->SetError(msg);
      return false;
    }
  }

  // Convert working directory to a full path.
  if (!working_directory.empty()) {
    const char* build_dir = this->Makefile->GetCurrentBinaryDirectory();
    working_directory =
      cmSystemTools::CollapseFullPath(working_directory, build_dir);
  }

  if (commandLines.empty() && !byproducts.empty()) {
    this->Makefile->IssueMessage(
      cmake::FATAL_ERROR,
      "BYPRODUCTS may not be specified without any COMMAND");
    return true;
  }
  if (commandLines.empty() && uses_terminal) {
    this->Makefile->IssueMessage(
      cmake::FATAL_ERROR,
      "USES_TERMINAL may not be specified without any COMMAND");
    return true;
  }
  if (commandLines.empty() && command_expand_lists) {
    this->Makefile->IssueMessage(
      cmake::FATAL_ERROR,
      "COMMAND_EXPAND_LISTS may not be specified without any COMMAND");
    return true;
  }

  // Add the utility target to the makefile.
  bool escapeOldStyle = !verbatim;
  cmTarget* target = this->Makefile->AddUtilityCommand(
    targetName, excludeFromAll, working_directory.c_str(), byproducts, depends,
    commandLines, escapeOldStyle, comment, uses_terminal,
    command_expand_lists);

  // Add additional user-specified source files to the target.
  target->AddSources(sources);

  return true;
}